

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QStyleSheetStyle::setProperties(QStyleSheetStyle *this,QWidget *w)

{
  int iVar1;
  long lVar2;
  DeclarationData *pDVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Declaration *pDVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  pointer piVar11;
  char *pcVar12;
  QSize QVar13;
  QDebug *pQVar14;
  QArrayDataPointer<char16_t> *pQVar15;
  uint uVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  QRect QVar18;
  undefined1 local_7d8 [16];
  QArrayDataPointer<char> local_7c8;
  QStringView local_7a8;
  QArrayDataPointer<int> local_798;
  QArrayDataPointer<QCss::Declaration> local_778;
  QArrayDataPointer<char16_t> local_758;
  QArrayDataPointer<char16_t> local_740;
  anon_union_24_3_e3d07ef4_for_data local_728;
  undefined1 *local_708;
  undefined1 *puStack_700;
  undefined1 *local_6f8;
  undefined1 *puStack_6f0;
  QArrayDataPointer<char16_t> local_6e8;
  char *local_6d0;
  QDuplicateTracker<QString,_32UL> propertySet;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_778.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_778.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_778.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  styleRules((QList<QCss::StyleRule> *)&propertySet,this,&w->super_QObject);
  local_6e8.d._0_4_ = 0;
  local_6e8.d._4_4_ = 0;
  local_6e8.ptr._0_4_ = 0;
  local_6e8.ptr._4_4_ = 0;
  local_6e8.size._0_4_ = 0;
  local_6e8.size._4_4_ = 0;
  declarations((QList<QCss::Declaration> *)&local_778,(QList<QCss::StyleRule> *)&propertySet,
               (QString *)&local_6e8,0x100);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6e8);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::StyleRule> *)&propertySet);
  local_798.d = (Data *)0x0;
  local_798.ptr = (int *)0x0;
  local_798.size = 0;
  memcpy(&propertySet,&DAT_005f5668,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker(&propertySet,local_778.size);
  uVar16 = (uint)local_778.size;
  while (uVar16 = uVar16 - 1, -1 < (int)uVar16) {
    pDVar3 = local_778.ptr[uVar16 & 0x7fffffff].d.d.ptr;
    pDVar4 = (pDVar3->property).d.d;
    local_6e8.d._0_4_ = SUB84(pDVar4,0);
    local_6e8.d._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
    pcVar5 = (pDVar3->property).d.ptr;
    local_6e8.ptr._0_4_ = SUB84(pcVar5,0);
    local_6e8.ptr._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
    qVar6 = (pDVar3->property).d.size;
    local_6e8.size._0_4_ = (undefined4)qVar6;
    local_6e8.size._4_4_ = (undefined4)((ulong)qVar6 >> 0x20);
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value =
           (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
      UNLOCK();
    }
    cVar8 = QString::startsWith((QLatin1String *)&local_6e8,10);
    if ((cVar8 != '\0') &&
       (bVar9 = QDuplicateTracker<QString,_32UL>::hasSeen(&propertySet,(QString *)&local_6e8),
       !bVar9)) {
      QList<int>::append((QList<int> *)&local_798,uVar16);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_6e8);
  }
  QDuplicateTracker<QString,_32UL>::~QDuplicateTracker(&propertySet);
  uVar16 = (uint)local_798.size;
  do {
    uVar16 = uVar16 - 1;
    if ((int)uVar16 < 0) {
      QArrayDataPointer<int>::~QArrayDataPointer(&local_798);
      QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_778);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return;
    }
    piVar11 = QList<int>::data((QList<int> *)&local_798);
    pDVar7 = local_778.ptr;
    iVar1 = piVar11[uVar16 & 0x7fffffff];
    pDVar3 = local_778.ptr[iVar1].d.d.ptr;
    local_7a8.m_data = (pDVar3->property).d.ptr;
    local_7a8.m_size = (pDVar3->property).d.size;
    local_7a8 = QStringView::mid(&local_7a8,10,-1);
    local_7c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_7c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_7c8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QStringView::toLatin1((QByteArray *)&local_7c8,&local_7a8);
    pcVar12 = (char *)(*(code *)**(undefined8 **)w)();
    iVar10 = QMetaObject::indexOfProperty(pcVar12);
    if (iVar10 == -1) {
      propertySet.buffer[0] = '\x02';
      propertySet.buffer[1] = '\0';
      propertySet.buffer[2] = '\0';
      propertySet.buffer[3] = '\0';
      propertySet.buffer[4] = '\0';
      propertySet.buffer[5] = '\0';
      propertySet.buffer[6] = '\0';
      propertySet.buffer[7] = '\0';
      propertySet.buffer[8] = '\0';
      propertySet.buffer[9] = '\0';
      propertySet.buffer[10] = '\0';
      propertySet.buffer[0xb] = '\0';
      propertySet.buffer[0xc] = '\0';
      propertySet.buffer[0xd] = '\0';
      propertySet.buffer[0xe] = '\0';
      propertySet.buffer[0xf] = '\0';
      propertySet.buffer[0x10] = '\0';
      propertySet.buffer[0x11] = '\0';
      propertySet.buffer[0x12] = '\0';
      propertySet.buffer[0x13] = '\0';
      propertySet.buffer[0x14] = '\0';
      propertySet.buffer[0x15] = '\0';
      propertySet.buffer[0x16] = '\0';
      propertySet.buffer[0x17] = '\0';
      propertySet.buffer._24_8_ = anon_var_dwarf_66827;
      QMessageLogger::warning();
      ::operator<<((Stream *)&local_6e8,(QWidget *)(local_7d8 + 8));
      pQVar14 = QDebug::operator<<((QDebug *)&local_6e8," does not have a property named ");
      QDebug::operator<<(pQVar14,local_7a8);
      QDebug::~QDebug((QDebug *)&local_6e8);
      QDebug::~QDebug((QDebug *)(local_7d8 + 8));
      goto LAB_00343aa4;
    }
    propertySet.buffer[0x10] = -0x56;
    propertySet.buffer[0x11] = -0x56;
    propertySet.buffer[0x12] = -0x56;
    propertySet.buffer[0x13] = -0x56;
    propertySet.buffer[0x14] = -0x56;
    propertySet.buffer[0x15] = -0x56;
    propertySet.buffer[0x16] = -0x56;
    propertySet.buffer[0x17] = -0x56;
    propertySet.buffer._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    propertySet.buffer[0] = -0x56;
    propertySet.buffer[1] = -0x56;
    propertySet.buffer[2] = -0x56;
    propertySet.buffer[3] = -0x56;
    propertySet.buffer[4] = -0x56;
    propertySet.buffer[5] = -0x56;
    propertySet.buffer[6] = -0x56;
    propertySet.buffer[7] = -0x56;
    propertySet.buffer[8] = -0x56;
    propertySet.buffer[9] = -0x56;
    propertySet.buffer[10] = -0x56;
    propertySet.buffer[0xb] = -0x56;
    propertySet.buffer[0xc] = -0x56;
    propertySet.buffer[0xd] = -0x56;
    propertySet.buffer[0xe] = -0x56;
    propertySet.buffer[0xf] = -0x56;
    QMetaObject::property((int)&propertySet);
    cVar8 = QMetaProperty::isWritable();
    if ((cVar8 == '\0') || (cVar8 = QMetaProperty::isDesignable(), cVar8 == '\0')) {
      local_6e8.d._0_4_ = 2;
      local_6e8.d._4_4_ = 0;
      local_6e8.ptr._0_4_ = 0;
      local_6e8.ptr._4_4_ = 0;
      local_6e8.size._0_4_ = 0;
      local_6e8.size._4_4_ = 0;
      local_6d0 = "default";
      QMessageLogger::warning();
      ::operator<<((Stream *)&local_708,(QWidget *)local_7d8);
      pQVar14 = QDebug::operator<<((QDebug *)&local_708," cannot design property named ");
      QDebug::operator<<(pQVar14,local_7a8);
      QDebug::~QDebug((QDebug *)&local_708);
      QDebug::~QDebug((QDebug *)local_7d8);
      goto LAB_00343aa4;
    }
    local_6e8.d._0_4_ = 0;
    local_6e8.d._4_4_ = 0;
    local_6e8.ptr._0_4_ = 0;
    local_6e8.ptr._4_4_ = 0;
    local_6e8.size._0_4_ = 0;
    local_6e8.size._4_4_ = 0;
    local_6d0 = (char *)0x2;
    local_6f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_6f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_708 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_700 = &DAT_aaaaaaaaaaaaaaaa;
    QObject::property((char *)&local_708);
    iVar10 = ::QVariant::typeId((QVariant *)&local_708);
    switch(iVar10) {
    case 0x1001:
      QCss::Declaration::uriValue();
      QPixmap::QPixmap((QPixmap *)&local_740,&local_758,0,0);
      QPixmap::operator_cast_to_QVariant((QVariant *)&local_728,(QPixmap *)&local_740);
      ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
      ::QVariant::~QVariant((QVariant *)&local_728);
      QPixmap::~QPixmap((QPixmap *)&local_740);
      goto LAB_00343904;
    case 0x1002:
      pQVar15 = &local_740;
      QPalette::QPalette((QPalette *)pQVar15);
      QCss::Declaration::brushValue((QPalette *)&local_758);
      QBrush::operator_cast_to_QVariant((QVariant *)&local_728,(QBrush *)&local_758);
      ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
      ::QVariant::~QVariant((QVariant *)&local_728);
      QBrush::~QBrush((QBrush *)&local_758);
      goto LAB_00343973;
    case 0x1003:
      pQVar15 = &local_758;
      QPalette::QPalette((QPalette *)pQVar15);
      auVar17 = QCss::Declaration::colorValue((QPalette *)(pDVar7 + iVar1));
      local_740.d = auVar17._0_8_;
      local_740.ptr._0_6_ = auVar17._8_6_;
      QColor::operator_cast_to_QVariant((QVariant *)&local_728,(QColor *)&local_740);
      ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
      ::QVariant::~QVariant((QVariant *)&local_728);
LAB_00343973:
      QPalette::~QPalette((QPalette *)pQVar15);
      break;
    case 0x1004:
    case 0x1007:
    case 0x1008:
    case 0x1009:
    case 0x100a:
switchD_00343757_caseD_1004:
      ::QVariant::operator=
                ((QVariant *)&local_6e8,
                 (QVariant *)(*(long *)(((QPalette *)(pDVar7 + iVar1))->d + 0x30) + 8));
      break;
    case 0x1005:
      QCss::Declaration::iconValue();
      QIcon::operator_cast_to_QVariant((QVariant *)&local_728,(QIcon *)&local_740);
      ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
      ::QVariant::~QVariant((QVariant *)&local_728);
      QIcon::~QIcon((QIcon *)&local_740);
      break;
    case 0x1006:
      QCss::Declaration::uriValue();
      QImage::QImage((QImage *)&local_740,(QString *)&local_758,(char *)0x0);
      QImage::operator_cast_to_QVariant((QVariant *)&local_728,(QImage *)&local_740);
      ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
      ::QVariant::~QVariant((QVariant *)&local_728);
      QImage::~QImage((QImage *)&local_740);
LAB_00343904:
      pQVar15 = &local_758;
LAB_003439df:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar15);
      break;
    case 0x100b:
      pQVar15 = &local_740;
      ::QVariant::toString();
      QKeySequence::QKeySequence((QKeySequence *)&local_758,(QString *)pQVar15,NativeText);
      QKeySequence::operator_cast_to_QVariant((QVariant *)&local_728,(QKeySequence *)&local_758);
      ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
      ::QVariant::~QVariant((QVariant *)&local_728);
      QKeySequence::~QKeySequence((QKeySequence *)&local_758);
      goto LAB_003439df;
    default:
      if (iVar10 == 0x13) {
        QVar18 = (QRect)QCss::Declaration::rectValue();
        ::QVariant::QVariant((QVariant *)&local_728,QVar18);
      }
      else {
        if (iVar10 != 0x15) goto switchD_00343757_caseD_1004;
        QVar13 = (QSize)QCss::Declaration::sizeValue();
        ::QVariant::QVariant((QVariant *)&local_728,QVar13);
      }
      ::QVariant::operator=((QVariant *)&local_6e8,(QVariant *)&local_728);
      ::QVariant::~QVariant((QVariant *)&local_728);
    }
    local_728.shared = (PrivateShared *)local_7c8.size;
    local_728._8_8_ = local_7c8.ptr;
    local_740.d = (Data *)QByteArrayView::lengthHelperCharArray("styleSheet",0xb);
    local_740.ptr = L"styleSheet";
    bVar9 = ::comparesEqual((QByteArrayView *)&local_728,(QByteArrayView *)&local_740);
    if ((!bVar9) || (cVar8 = ::QVariant::equals((QVariant *)&local_708), cVar8 == '\0')) {
      pcVar12 = local_7c8.ptr;
      if (local_7c8.ptr == (char *)0x0) {
        pcVar12 = (char *)&QByteArray::_empty;
      }
      QObject::setProperty(&w->super_QObject,pcVar12,(QVariant *)&local_6e8);
    }
    ::QVariant::~QVariant((QVariant *)&local_708);
    ::QVariant::~QVariant((QVariant *)&local_6e8);
LAB_00343aa4:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_7c8);
  } while( true );
}

Assistant:

void QStyleSheetStyle::setProperties(QWidget *w)
{
    // The final occurrence of each property is authoritative.
    // Set value for each property in the order of property final occurrence
    // since properties interact.

    const QList<Declaration> decls = declarations(styleRules(w), QString());
    QList<int> finals; // indices in reverse order of each property's final occurrence

    {
        // scan decls for final occurrence of each "qproperty"
        QDuplicateTracker<QString> propertySet(decls.size());
        for (int i = decls.size() - 1; i >= 0; --i) {
            const QString property = decls.at(i).d->property;
            if (!property.startsWith("qproperty-"_L1, Qt::CaseInsensitive))
                continue;
            if (!propertySet.hasSeen(property))
                finals.append(i);
        }
    }

    for (int i = finals.size() - 1; i >= 0; --i) {
        const Declaration &decl = decls.at(finals[i]);
        QStringView property = decl.d->property;
        property = property.mid(10); // strip "qproperty-"
        const auto propertyL1 = property.toLatin1();

        const QMetaObject *metaObject = w->metaObject();
        int index = metaObject->indexOfProperty(propertyL1);
        if (Q_UNLIKELY(index == -1)) {
            qWarning() << w << " does not have a property named " << property;
            continue;
        }
        const QMetaProperty metaProperty = metaObject->property(index);
        if (Q_UNLIKELY(!metaProperty.isWritable() || !metaProperty.isDesignable())) {
            qWarning() << w << " cannot design property named " << property;
            continue;
        }

        QVariant v;
        const QVariant value = w->property(propertyL1);
        switch (value.userType()) {
        case QMetaType::QIcon: v = decl.iconValue(); break;
        case QMetaType::QImage: v = QImage(decl.uriValue()); break;
        case QMetaType::QPixmap: v = QPixmap(decl.uriValue()); break;
        case QMetaType::QRect: v = decl.rectValue(); break;
        case QMetaType::QSize: v = decl.sizeValue(); break;
        case QMetaType::QColor: v = decl.colorValue(); break;
        case QMetaType::QBrush: v = decl.brushValue(); break;
#ifndef QT_NO_SHORTCUT
        case QMetaType::QKeySequence: v = QKeySequence(decl.d->values.at(0).variant.toString()); break;
#endif
        default: v = decl.d->values.at(0).variant; break;
        }

        if (propertyL1 == QByteArrayView("styleSheet") && value == v)
            continue;

        w->setProperty(propertyL1, v);
    }
}